

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathVariableLookup(xmlXPathContextPtr ctxt,xmlChar *name)

{
  xmlXPathObjectPtr ret;
  xmlChar *name_local;
  xmlXPathContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    ctxt_local = (xmlXPathContextPtr)0x0;
  }
  else if (ctxt->varLookupFunc == (xmlXPathVariableLookupFunc)0x0) {
    ctxt_local = (xmlXPathContextPtr)xmlXPathVariableLookupNS(ctxt,name,(xmlChar *)0x0);
  }
  else {
    ctxt_local = (xmlXPathContextPtr)(*ctxt->varLookupFunc)(ctxt->varLookupData,name,(xmlChar *)0x0)
    ;
  }
  return (xmlXPathObjectPtr)ctxt_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathVariableLookup(xmlXPathContextPtr ctxt, const xmlChar *name) {
    if (ctxt == NULL)
	return(NULL);

    if (ctxt->varLookupFunc != NULL) {
	xmlXPathObjectPtr ret;

	ret = ((xmlXPathVariableLookupFunc)ctxt->varLookupFunc)
	        (ctxt->varLookupData, name, NULL);
	return(ret);
    }
    return(xmlXPathVariableLookupNS(ctxt, name, NULL));
}